

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extprivkey.cpp
# Opt level: O0

void __thiscall
ExtPrivkey_FromParentKeyTest_Test::ExtPrivkey_FromParentKeyTest_Test
          (ExtPrivkey_FromParentKeyTest_Test *this)

{
  ExtPrivkey_FromParentKeyTest_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ExtPrivkey_FromParentKeyTest_Test_00886848;
  return;
}

Assistant:

TEST(ExtPrivkey, FromParentKeyTest) {
  // base: xprv9zt1onyw8BdEf7SQ6wUVH3bQQdGD9iy9QzXveQQRhX7i5iUN7jZgLbqFEe491LfjozztYa6bJAGZ65GmDCNcbjMdjZcgmdisPJwVjcfcDhV
  // path: 4
  std::string ext_base58 = "xprvA3hskUkqh1sEsTnVmA1WTv74keit2RHGeCvG77peTHgtHjYu5xFAe3tmVosXLyn3DyS2S7duUkPjYihSULBwWgR51pX1ShuyDW3oJZD36YX";
  ExtPrivkey extkey = ExtPrivkey(NetType::kMainnet,
      Privkey("73a2361673d25f998d1e9d94aabdeba8ac1ddd4628bc4f55341397d263bd560c"),
      ByteData256("28009126a24557d32ff2c5da21850dd06529f34faed53b4a3552b5ed4bda35d5"),
      uint8_t{4},
      uint32_t{8});

  EXPECT_STREQ("0488ade405ae05dbb7000000088fa9c804362c158cb0a6a4e9573390b9fcb0c1625f1f33fae5fa3b949082293c0047131fdbfe2d1f53cd5c404199e243197cea058da8edcc47f0055b019afc102a", extkey.GetData().GetHex().c_str());
  EXPECT_STREQ(ext_base58.c_str(), extkey.ToString().c_str());
  EXPECT_TRUE(extkey.IsValid());
  EXPECT_EQ(3084584366, extkey.GetFingerprint());
  EXPECT_STREQ("ae05dbb7", extkey.GetFingerprintData().GetHex().c_str());
  EXPECT_EQ(extprivkey_kVersionMainnetPrivkey, extkey.GetVersion());
  EXPECT_STREQ("0488ade4", extkey.GetVersionData().GetHex().c_str());
  EXPECT_EQ(5, extkey.GetDepth());
  EXPECT_EQ(8, extkey.GetChildNum());
  EXPECT_STREQ("8fa9c804362c158cb0a6a4e9573390b9fcb0c1625f1f33fae5fa3b949082293c", extkey.GetChainCode().GetHex().c_str());
  EXPECT_STREQ("47131fdbfe2d1f53cd5c404199e243197cea058da8edcc47f0055b019afc102a", extkey.GetPrivkey().GetHex().c_str());
}